

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chaiscript_common.hpp
# Opt level: O3

string * __thiscall
chaiscript::exception::eval_error::pretty_print_abi_cxx11_
          (string *__return_storage_ptr__,eval_error *this)

{
  undefined8 *puVar1;
  char *__s;
  size_t sVar2;
  ostream *poVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  ulong uVar7;
  ostringstream ss;
  undefined1 auStack_1f8 [8];
  string local_1f0;
  string local_1d0;
  string *local_1b0;
  long local_1a8 [14];
  ios_base local_138 [264];
  
  local_1b0 = __return_storage_ptr__;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
  __s = (char *)(**(code **)(*(long *)this + 0x10))(this);
  if (__s == (char *)0x0) {
    std::ios::clear((int)auStack_1f8 + (int)*(undefined8 *)(local_1a8[0] + -0x18) + 0x50);
  }
  else {
    sVar2 = strlen(__s);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,__s,sVar2);
  }
  if (*(long *)(this + 0x78) != *(long *)(this + 0x80)) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,"during evaluation at (",0x16);
    poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)local_1a8,
                        (char *)**(undefined8 **)(*(long *)(this + 0x78) + 0x38),
                        (*(undefined8 **)(*(long *)(this + 0x78) + 0x38))[1]);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3," ",1);
    startpos<chaiscript::AST_Node_Trace>(&local_1f0,*(AST_Node_Trace **)(this + 0x78));
    poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar3,(char *)CONCAT71(local_1f0._M_dataplus._M_p._1_7_,
                                                local_1f0._M_dataplus._M_p._0_1_),
                        local_1f0._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,")\n",2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT71(local_1f0._M_dataplus._M_p._1_7_,local_1f0._M_dataplus._M_p._0_1_) !=
        &local_1f0.field_2) {
      operator_delete((undefined1 *)
                      CONCAT71(local_1f0._M_dataplus._M_p._1_7_,local_1f0._M_dataplus._M_p._0_1_),
                      local_1f0.field_2._M_allocated_capacity + 1);
    }
    local_1f0._M_dataplus._M_p._0_1_ = 10;
    poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)local_1a8,(char *)&local_1f0,1);
    poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar3,*(char **)(this + 0x58),*(long *)(this + 0x60));
    local_1f0._M_dataplus._M_p._0_1_ = 10;
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,(char *)&local_1f0,1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"  ",2);
    poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)local_1a8,
                        (char *)**(undefined8 **)(*(long *)(this + 0x78) + 0x38),
                        (*(undefined8 **)(*(long *)(this + 0x78) + 0x38))[1]);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3," (",2);
    startpos<chaiscript::AST_Node_Trace>(&local_1f0,*(AST_Node_Trace **)(this + 0x78));
    poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar3,(char *)CONCAT71(local_1f0._M_dataplus._M_p._1_7_,
                                                local_1f0._M_dataplus._M_p._0_1_),
                        local_1f0._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,") \'",3);
    AST_Node_Trace::pretty_print_abi_cxx11_(&local_1d0,*(AST_Node_Trace **)(this + 0x78));
    poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar3,local_1d0._M_dataplus._M_p,local_1d0._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\'",1);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1d0._M_dataplus._M_p != &local_1d0.field_2) {
      operator_delete(local_1d0._M_dataplus._M_p,local_1d0.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT71(local_1f0._M_dataplus._M_p._1_7_,local_1f0._M_dataplus._M_p._0_1_) !=
        &local_1f0.field_2) {
      operator_delete((undefined1 *)
                      CONCAT71(local_1f0._M_dataplus._M_p._1_7_,local_1f0._M_dataplus._M_p._0_1_),
                      local_1f0.field_2._M_allocated_capacity + 1);
    }
    lVar4 = *(long *)(this + 0x78);
    lVar5 = *(long *)(this + 0x80);
    if (1 < (ulong)((lVar5 - lVar4 >> 5) * -0x5555555555555555)) {
      uVar7 = 1;
      lVar6 = 0x60;
      do {
        if ((*(int *)(lVar4 + lVar6) != 10) && (*(int *)(lVar4 + lVar6) != 0x14)) {
          local_1f0._M_dataplus._M_p._0_1_ = 10;
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_1a8,(char *)&local_1f0,1);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"  from ",7);
          puVar1 = *(undefined8 **)(*(long *)(this + 0x78) + 0x38 + lVar6);
          poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                             ((ostream *)local_1a8,(char *)*puVar1,puVar1[1]);
          std::__ostream_insert<char,std::char_traits<char>>(poVar3," (",2);
          startpos<chaiscript::AST_Node_Trace>
                    (&local_1f0,(AST_Node_Trace *)(*(long *)(this + 0x78) + lVar6));
          poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                             (poVar3,(char *)CONCAT71(local_1f0._M_dataplus._M_p._1_7_,
                                                      local_1f0._M_dataplus._M_p._0_1_),
                              local_1f0._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>(poVar3,") \'",3);
          AST_Node_Trace::pretty_print_abi_cxx11_
                    (&local_1d0,(AST_Node_Trace *)(*(long *)(this + 0x78) + lVar6));
          poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                             (poVar3,local_1d0._M_dataplus._M_p,local_1d0._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\'",1);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1d0._M_dataplus._M_p != &local_1d0.field_2) {
            operator_delete(local_1d0._M_dataplus._M_p,local_1d0.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)CONCAT71(local_1f0._M_dataplus._M_p._1_7_,local_1f0._M_dataplus._M_p._0_1_) !=
              &local_1f0.field_2) {
            operator_delete((undefined1 *)
                            CONCAT71(local_1f0._M_dataplus._M_p._1_7_,
                                     local_1f0._M_dataplus._M_p._0_1_),
                            local_1f0.field_2._M_allocated_capacity + 1);
          }
          lVar4 = *(long *)(this + 0x78);
          lVar5 = *(long *)(this + 0x80);
        }
        uVar7 = uVar7 + 1;
        lVar6 = lVar6 + 0x60;
      } while (uVar7 < (ulong)((lVar5 - lVar4 >> 5) * -0x5555555555555555));
    }
  }
  local_1f0._M_dataplus._M_p._0_1_ = 10;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,(char *)&local_1f0,1);
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
  std::ios_base::~ios_base(local_138);
  return local_1b0;
}

Assistant:

std::string pretty_print() const {
        std::ostringstream ss;

        ss << what();
        if (!call_stack.empty()) {
          ss << "during evaluation at (" << fname(call_stack[0]) << " " << startpos(call_stack[0]) << ")\n";
          ss << '\n'
             << detail << '\n';
          ss << "  " << fname(call_stack[0]) << " (" << startpos(call_stack[0]) << ") '" << pretty(call_stack[0]) << "'";
          for (size_t j = 1; j < call_stack.size(); ++j) {
            if (id(call_stack[j]) != chaiscript::AST_Node_Type::Block && id(call_stack[j]) != chaiscript::AST_Node_Type::File) {
              ss << '\n';
              ss << "  from " << fname(call_stack[j]) << " (" << startpos(call_stack[j]) << ") '" << pretty(call_stack[j]) << "'";
            }
          }
        }
        ss << '\n';
        return ss.str();
      }